

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall
base_iterator_matrix_sparse_element_test_increment_and_decrement_Test::
~base_iterator_matrix_sparse_element_test_increment_and_decrement_Test
          (base_iterator_matrix_sparse_element_test_increment_and_decrement_Test *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  (this->super_base_iterator_matrix_sparse_element_test).super_Test._vptr_Test =
       (_func_int **)&PTR__base_iterator_matrix_sparse_element_test_00161870;
  pdVar1 = (this->super_base_iterator_matrix_sparse_element_test).entries.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_base_iterator_matrix_sparse_element_test).entries.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  piVar2 = (this->super_base_iterator_matrix_sparse_element_test).columns.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_base_iterator_matrix_sparse_element_test).columns.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(base_iterator_matrix_sparse_element_test, increment_and_decrement) {
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter(&columns[0], &entries[0]);
  ++iter;
  EXPECT_EQ((*iter).i_column(), 1);
  EXPECT_EQ((*iter).value(), 2.0);

  iter++;
  EXPECT_EQ((*iter).i_column(), 2);
  EXPECT_EQ((*iter).value(), 3.0);

  --iter;
  EXPECT_EQ((*iter).i_column(), 1);
  EXPECT_EQ((*iter).value(), 2.0);

  iter--;
  EXPECT_EQ((*iter).i_column(), 0);
  EXPECT_EQ((*iter).value(), 1.0);
}